

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.h
# Opt level: O1

optional<AssumeutxoData> * __thiscall
CChainParams::AssumeutxoForBlockhash
          (optional<AssumeutxoData> *__return_storage_ptr__,CChainParams *this,uint256 *blockhash)

{
  long lVar1;
  pointer pAVar2;
  ushort uVar3;
  long lVar4;
  pointer pAVar5;
  optional<AssumeutxoData> *poVar6;
  long in_FS_OFFSET;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar5 = (this->m_assumeutxo_data).
           super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar2 = (this->m_assumeutxo_data).
           super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar7 = pAVar5 == pAVar2;
  if (!bVar7) {
    auVar10[0] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0] ==
                  (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0]);
    auVar10[1] = -((blockhash->super_base_blob<256U>).m_data._M_elems[1] ==
                  (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[1]);
    auVar10[2] = -((blockhash->super_base_blob<256U>).m_data._M_elems[2] ==
                  (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[2]);
    auVar10[3] = -((blockhash->super_base_blob<256U>).m_data._M_elems[3] ==
                  (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[3]);
    auVar10[4] = -((blockhash->super_base_blob<256U>).m_data._M_elems[4] ==
                  (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[4]);
    auVar10[5] = -((blockhash->super_base_blob<256U>).m_data._M_elems[5] ==
                  (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[5]);
    auVar10[6] = -((blockhash->super_base_blob<256U>).m_data._M_elems[6] ==
                  (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[6]);
    auVar10[7] = -((blockhash->super_base_blob<256U>).m_data._M_elems[7] ==
                  (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[7]);
    auVar10[8] = -((blockhash->super_base_blob<256U>).m_data._M_elems[8] ==
                  (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[8]);
    auVar10[9] = -((blockhash->super_base_blob<256U>).m_data._M_elems[9] ==
                  (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[9]);
    auVar10[10] = -((blockhash->super_base_blob<256U>).m_data._M_elems[10] ==
                   (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[10]);
    auVar10[0xb] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0xb] ==
                    (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar10[0xc] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0xc] ==
                    (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar10[0xd] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0xd] ==
                    (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar10[0xe] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0xe] ==
                    (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar10[0xf] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0xf] ==
                    (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar8[0] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x10] ==
                 (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar8[1] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x11] ==
                 (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar8[2] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x12] ==
                 (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar8[3] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x13] ==
                 (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar8[4] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x14] ==
                 (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar8[5] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x15] ==
                 (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar8[6] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x16] ==
                 (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar8[7] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x17] ==
                 (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar8[8] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x18] ==
                 (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar8[9] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x19] ==
                 (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar8[10] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x1a] ==
                  (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar8[0xb] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x1b] ==
                   (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar8[0xc] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x1c] ==
                   (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar8[0xd] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x1d] ==
                   (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar8[0xe] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x1e] ==
                   (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar8[0xf] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x1f] ==
                   (pAVar5->blockhash).super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar8 = auVar8 & auVar10;
    uVar3 = (ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar8[0xf] >> 7) << 0xf;
    while (uVar3 != 0xffff) {
      bVar7 = pAVar5 + 1 == pAVar2;
      if (bVar7) goto LAB_0021873b;
      auVar11[0] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0] ==
                    pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0]);
      auVar11[1] = -((blockhash->super_base_blob<256U>).m_data._M_elems[1] ==
                    pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[1]);
      auVar11[2] = -((blockhash->super_base_blob<256U>).m_data._M_elems[2] ==
                    pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[2]);
      auVar11[3] = -((blockhash->super_base_blob<256U>).m_data._M_elems[3] ==
                    pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[3]);
      auVar11[4] = -((blockhash->super_base_blob<256U>).m_data._M_elems[4] ==
                    pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[4]);
      auVar11[5] = -((blockhash->super_base_blob<256U>).m_data._M_elems[5] ==
                    pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[5]);
      auVar11[6] = -((blockhash->super_base_blob<256U>).m_data._M_elems[6] ==
                    pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[6]);
      auVar11[7] = -((blockhash->super_base_blob<256U>).m_data._M_elems[7] ==
                    pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[7]);
      auVar11[8] = -((blockhash->super_base_blob<256U>).m_data._M_elems[8] ==
                    pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[8]);
      auVar11[9] = -((blockhash->super_base_blob<256U>).m_data._M_elems[9] ==
                    pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[9]);
      auVar11[10] = -((blockhash->super_base_blob<256U>).m_data._M_elems[10] ==
                     pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[10]);
      auVar11[0xb] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar11[0xc] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar11[0xd] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar11[0xe] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar11[0xf] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar9[0] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x10] ==
                   pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar9[1] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x11] ==
                   pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar9[2] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x12] ==
                   pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar9[3] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x13] ==
                   pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar9[4] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x14] ==
                   pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar9[5] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x15] ==
                   pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar9[6] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x16] ==
                   pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar9[7] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x17] ==
                   pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar9[8] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x18] ==
                   pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar9[9] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x19] ==
                   pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar9[10] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x1a] ==
                    pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar9[0xb] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x1b] ==
                     pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar9[0xc] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x1c] ==
                     pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar9[0xd] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x1d] ==
                     pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar9[0xe] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x1e] ==
                     pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar9[0xf] = -((blockhash->super_base_blob<256U>).m_data._M_elems[0x1f] ==
                     pAVar5[1].blockhash.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar9 = auVar9 & auVar11;
      pAVar5 = pAVar5 + 1;
      uVar3 = (ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar9[0xf] >> 7) << 0xf;
    }
    poVar6 = __return_storage_ptr__;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined8 *)&(poVar6->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload =
           *(undefined8 *)pAVar5;
      pAVar5 = (pointer)((pAVar5->hash_serialized).super_BaseHash<uint256>.m_hash.
                         super_base_blob<256U>.m_data._M_elems + 4);
      poVar6 = (optional<AssumeutxoData> *)
               ((long)&(poVar6->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload + 8);
    }
    (__return_storage_ptr__->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload.
    super__Optional_payload_base<AssumeutxoData>._M_engaged = true;
    if (!bVar7) goto LAB_0021873f;
  }
LAB_0021873b:
  (__return_storage_ptr__->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_engaged = false;
LAB_0021873f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<AssumeutxoData> AssumeutxoForBlockhash(const uint256& blockhash) const
    {
        return FindFirst(m_assumeutxo_data, [&](const auto& d) { return d.blockhash == blockhash; });
    }